

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

size_t cs_disasm(csh ud,uint8_t *buffer,size_t size,uint64_t offset,size_t count,cs_insn **insn)

{
  cs_skipdata_cb_t p_Var1;
  _Bool _Var2;
  cs_insn *pcVar3;
  cs_detail *pcVar4;
  size_t __n;
  cs_insn *pcVar5;
  cs_insn *pcVar6;
  size_t sVar7;
  uint8_t *buffer_00;
  cs_detail **ppcVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  cs_struct *pcVar14;
  cs_insn **ppcVar15;
  uint16_t insn_size;
  MCInst mci;
  SStream ss;
  uint16_t local_5d2;
  size_t local_5d0;
  size_t local_5c8;
  cs_insn *local_5c0;
  ulong local_5b8;
  size_t local_5b0;
  size_t local_5a8;
  cs_insn **local_5a0;
  cs_struct *local_598;
  size_t local_590;
  uint8_t *local_588;
  long local_580;
  uint64_t local_578;
  size_t local_570;
  MCInst local_568;
  SStream local_234;
  
  if (ud != 0) {
    *(undefined4 *)(ud + 0x58) = 0;
    uVar13 = 0x20;
    if (count - 1 < 0x20) {
      uVar13 = count & 0xffffffff;
    }
    sVar12 = uVar13 * 0xf0;
    local_590 = size;
    local_588 = buffer;
    pcVar3 = (cs_insn *)(*cs_mem_malloc)(sVar12);
    if (pcVar3 != (cs_insn *)0x0) {
      local_5c0 = pcVar3;
      local_5a0 = insn;
      local_598 = (cs_struct *)ud;
      if (local_590 == 0) {
        local_5c8 = 0;
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        sVar7 = 1;
        lVar11 = 0xf0;
        local_5a8 = local_590;
        local_5c8 = 0;
        buffer_00 = local_588;
        local_5d0 = sVar12;
        local_578 = offset;
        local_570 = count;
        do {
          local_5b8 = uVar10;
          local_5b0 = sVar7;
          local_580 = lVar11;
          MCInst_Init(&local_568);
          pcVar14 = local_598;
          local_568.csh = local_598;
          local_568.address = offset;
          if (local_598->detail == CS_OPT_OFF) {
            pcVar4 = (cs_detail *)0x0;
          }
          else {
            pcVar4 = (cs_detail *)(*cs_mem_malloc)(0x5f8);
          }
          pcVar3->detail = pcVar4;
          pcVar3->address = offset;
          local_568.flat_insn = pcVar3;
          _Var2 = (*pcVar14->disasm)((csh)pcVar14,buffer_00,local_5a8,&local_568,&local_5d2,offset,
                                     pcVar14->getinsn_info);
          if (_Var2) {
            SStream_Init(&local_234);
            (local_568.flat_insn)->size = local_5d2;
            (*pcVar14->insn_id)(pcVar14,pcVar3,local_568.Opcode);
            (*pcVar14->printer)(&local_568,&local_234,pcVar14->printer_info);
            fill_insn(pcVar14,pcVar3,local_234.buffer,&local_568,pcVar14->post_printer,buffer_00);
            __n = (size_t)local_5d2;
          }
          else {
            if (pcVar14->detail != CS_OPT_OFF) {
              (*cs_mem_free)(pcVar3->detail);
            }
            uVar10 = local_5b8;
            sVar12 = local_5d0;
            if (pcVar14->skipdata != true) break;
            __n = (size_t)pcVar14->skipdata_size;
            if (local_5a8 < __n) {
              local_5c8 = local_5b0 - 1;
              break;
            }
            p_Var1 = (pcVar14->skipdata_setup).callback;
            if ((p_Var1 != (cs_skipdata_cb_t)0x0) &&
               (__n = (*p_Var1)(local_588,local_590,offset - local_578,
                                (pcVar14->skipdata_setup).user_data), uVar10 = local_5b8,
               sVar12 = local_5d0, local_5a8 <= __n - 1)) break;
            pcVar3->id = 0;
            pcVar3->address = offset;
            pcVar3->size = (uint16_t)__n;
            memcpy(pcVar3->bytes,buffer_00,__n);
            strncpy(pcVar3->mnemonic,(pcVar14->skipdata_setup).mnemonic,0x1f);
            skipdata_opstr(pcVar3->op_str,buffer_00,__n);
            pcVar3->detail = (cs_detail *)0x0;
          }
          pcVar6 = local_5c0;
          uVar9 = (int)local_5b8 + 1;
          uVar10 = (ulong)uVar9;
          if (local_570 != 0 && local_570 == local_5b0) {
            local_5c8 = local_5b0;
            sVar12 = local_5d0;
            break;
          }
          if (uVar9 == (uint)uVar13) {
            uVar13 = (ulong)((uint)uVar13 << 3) / 5;
            sVar12 = uVar13 * 0xf0 + local_5d0;
            pcVar5 = (cs_insn *)(*cs_mem_realloc)(local_5c0,sVar12);
            pcVar14 = local_598;
            if (pcVar5 == (cs_insn *)0x0) {
              if (local_5b0 != 0 && local_598->detail != CS_OPT_OFF) {
                ppcVar8 = &pcVar6->detail;
                sVar12 = local_5b0;
                do {
                  (*cs_mem_free)(*ppcVar8);
                  ppcVar8 = ppcVar8 + 0x1e;
                  sVar12 = sVar12 - 1;
                } while (sVar12 != 0);
              }
              (*cs_mem_free)(pcVar6);
              *local_5a0 = (cs_insn *)0x0;
              goto LAB_00143d80;
            }
            pcVar3 = (cs_insn *)(pcVar5->bytes + local_580 + -0x12);
            uVar10 = 0;
            local_5d0 = sVar12;
            local_5c0 = pcVar5;
          }
          else {
            pcVar3 = pcVar3 + 1;
          }
          buffer_00 = buffer_00 + __n;
          offset = offset + __n;
          sVar7 = local_5b0 + 1;
          lVar11 = local_580 + 0xf0;
          local_5c8 = local_5c8 + 1;
          local_5a8 = local_5a8 - __n;
          sVar12 = local_5d0;
        } while (local_5a8 != 0);
      }
      ppcVar15 = local_5a0;
      pcVar3 = local_5c0;
      sVar7 = local_5c8;
      if (local_5c8 == 0) {
        (*cs_mem_free)(local_5c0);
        pcVar6 = (cs_insn *)0x0;
        ppcVar15 = local_5a0;
      }
      else {
        uVar9 = (int)uVar13 - (int)uVar10;
        pcVar6 = local_5c0;
        if ((uVar9 != 0) &&
           (pcVar6 = (cs_insn *)(*cs_mem_realloc)(local_5c0,(ulong)uVar9 * -0xf0 + sVar12),
           pcVar14 = local_598, pcVar6 == (cs_insn *)0x0)) {
          if (local_598->detail != CS_OPT_OFF) {
            ppcVar8 = &pcVar3->detail;
            do {
              (*cs_mem_free)(*ppcVar8);
              ppcVar8 = ppcVar8 + 0x1e;
              sVar7 = sVar7 - 1;
            } while (sVar7 != 0);
          }
          (*cs_mem_free)(pcVar3);
          *ppcVar15 = (cs_insn *)0x0;
LAB_00143d80:
          pcVar14->errnum = CS_ERR_MEM;
          return 0;
        }
      }
      *ppcVar15 = pcVar6;
      return sVar7;
    }
    *(undefined4 *)(ud + 0x58) = 1;
  }
  return 0;
}

Assistant:

CAPSTONE_EXPORT
size_t cs_disasm(csh ud, const uint8_t *buffer, size_t size, uint64_t offset, size_t count, cs_insn **insn)
{
	struct cs_struct *handle;
	MCInst mci;
	uint16_t insn_size;
	size_t c = 0, i;
	unsigned int f = 0;	// index of the next instruction in the cache
	cs_insn *insn_cache;	// cache contains disassembled instructions
	void *total = NULL;
	size_t total_size = 0;	// total size of output buffer containing all insns
	bool r;
	void *tmp;
	size_t skipdata_bytes;
	uint64_t offset_org; // save all the original info of the buffer
	size_t size_org;
	const uint8_t *buffer_org;
	unsigned int cache_size = INSN_CACHE_SIZE;
	size_t next_offset;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		// FIXME: how to handle this case:
		// handle->errnum = CS_ERR_HANDLE;
		return 0;
	}

	handle->errnum = CS_ERR_OK;

#ifdef CAPSTONE_USE_SYS_DYN_MEM
	if (count > 0 && count <= INSN_CACHE_SIZE)
		cache_size = (unsigned int) count;
#endif

	// save the original offset for SKIPDATA
	buffer_org = buffer;
	offset_org = offset;
	size_org = size;

	total_size = sizeof(cs_insn) * cache_size;
	total = cs_mem_malloc(total_size);
	if (total == NULL) {
		// insufficient memory
		handle->errnum = CS_ERR_MEM;
		return 0;
	}

	insn_cache = total;

	while (size > 0) {
		MCInst_Init(&mci);
		mci.csh = handle;

		// relative branches need to know the address & size of current insn
		mci.address = offset;

		if (handle->detail) {
			// allocate memory for @detail pointer
			insn_cache->detail = cs_mem_malloc(sizeof(cs_detail));
		} else {
			insn_cache->detail = NULL;
		}

		// save all the information for non-detailed mode
		mci.flat_insn = insn_cache;
		mci.flat_insn->address = offset;
#ifdef CAPSTONE_DIET
		// zero out mnemonic & op_str
		mci.flat_insn->mnemonic[0] = '\0';
		mci.flat_insn->op_str[0] = '\0';
#endif

		r = handle->disasm(ud, buffer, size, &mci, &insn_size, offset, handle->getinsn_info);
		if (r) {
			SStream ss;
			SStream_Init(&ss);

			mci.flat_insn->size = insn_size;

			// map internal instruction opcode to public insn ID
			handle->insn_id(handle, insn_cache, mci.Opcode);

			handle->printer(&mci, &ss, handle->printer_info);

			fill_insn(handle, insn_cache, ss.buffer, &mci, handle->post_printer, buffer);

			next_offset = insn_size;
		} else	{
			// encounter a broken instruction

			// free memory of @detail pointer
			if (handle->detail) {
				cs_mem_free(insn_cache->detail);
			}

			// if there is no request to skip data, or remaining data is too small,
			// then bail out
			if (!handle->skipdata || handle->skipdata_size > size)
				break;

			if (handle->skipdata_setup.callback) {
				skipdata_bytes = handle->skipdata_setup.callback(buffer_org, size_org,
						(size_t)(offset - offset_org), handle->skipdata_setup.user_data);
				if (skipdata_bytes > size)
					// remaining data is not enough
					break;

				if (!skipdata_bytes)
					// user requested not to skip data, so bail out
					break;
			} else
				skipdata_bytes = handle->skipdata_size;

			// we have to skip some amount of data, depending on arch & mode
			insn_cache->id = 0;	// invalid ID for this "data" instruction
			insn_cache->address = offset;
			insn_cache->size = (uint16_t)skipdata_bytes;
			memcpy(insn_cache->bytes, buffer, skipdata_bytes);
			strncpy(insn_cache->mnemonic, handle->skipdata_setup.mnemonic,
					sizeof(insn_cache->mnemonic) - 1);
			skipdata_opstr(insn_cache->op_str, buffer, skipdata_bytes);
			insn_cache->detail = NULL;

			next_offset = skipdata_bytes;
		}

		// one more instruction entering the cache
		f++;

		// one more instruction disassembled
		c++;
		if (count > 0 && c == count)
			// already got requested number of instructions
			break;

		if (f == cache_size) {
			// full cache, so expand the cache to contain incoming insns
			cache_size = cache_size * 8 / 5; // * 1.6 ~ golden ratio
			total_size += (sizeof(cs_insn) * cache_size);
			tmp = cs_mem_realloc(total, total_size);
			if (tmp == NULL) {	// insufficient memory
				if (handle->detail) {
					insn_cache = (cs_insn *)total;
					for (i = 0; i < c; i++, insn_cache++)
						cs_mem_free(insn_cache->detail);
				}

				cs_mem_free(total);
				*insn = NULL;
				handle->errnum = CS_ERR_MEM;
				return 0;
			}

			total = tmp;
			// continue to fill in the cache after the last instruction
			insn_cache = (cs_insn *)((char *)total + sizeof(cs_insn) * c);

			// reset f back to 0, so we fill in the cache from begining
			f = 0;
		} else
			insn_cache++;

		buffer += next_offset;
		size -= next_offset;
		offset += next_offset;
	}

	if (!c) {
		// we did not disassemble any instruction
		cs_mem_free(total);
		total = NULL;
	} else if (f != cache_size) {
		// total did not fully use the last cache, so downsize it
		tmp = cs_mem_realloc(total, total_size - (cache_size - f) * sizeof(*insn_cache));
		if (tmp == NULL) {	// insufficient memory
			// free all detail pointers
			if (handle->detail) {
				insn_cache = (cs_insn *)total;
				for (i = 0; i < c; i++, insn_cache++)
					cs_mem_free(insn_cache->detail);
			}

			cs_mem_free(total);
			*insn = NULL;

			handle->errnum = CS_ERR_MEM;
			return 0;
		}

		total = tmp;
	}

	*insn = total;

	return c;
}